

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

die_range_info_iterator __thiscall
llvm::DWARFVerifier::DieRangeInfo::insert(DieRangeInfo *this,DieRangeInfo *RI)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var1 = &(this->Children)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->Children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      std::
      _Rb_tree<llvm::DWARFVerifier::DieRangeInfo,llvm::DWARFVerifier::DieRangeInfo,std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,std::less<llvm::DWARFVerifier::DieRangeInfo>,std::allocator<llvm::DWARFVerifier::DieRangeInfo>>
      ::_M_insert_unique<llvm::DWARFVerifier::DieRangeInfo_const&>
                ((_Rb_tree<llvm::DWARFVerifier::DieRangeInfo,llvm::DWARFVerifier::DieRangeInfo,std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,std::less<llvm::DWARFVerifier::DieRangeInfo>,std::allocator<llvm::DWARFVerifier::DieRangeInfo>>
                  *)&this->Children,RI);
      return (die_range_info_iterator)&p_Var1->_M_header;
    }
    bVar2 = intersects((DieRangeInfo *)(p_Var3 + 1),RI);
    if (bVar2) break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  return (die_range_info_iterator)p_Var3;
}

Assistant:

DWARFVerifier::DieRangeInfo::die_range_info_iterator
DWARFVerifier::DieRangeInfo::insert(const DieRangeInfo &RI) {
  auto End = Children.end();
  auto Iter = Children.begin();
  while (Iter != End) {
    if (Iter->intersects(RI))
      return Iter;
    ++Iter;
  }
  Children.insert(RI);
  return Children.end();
}